

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::removeFieldAt(QWizardPrivate *this,int index)

{
  QWizardField *pQVar1;
  QObject *pQVar2;
  QWizardField *pQVar3;
  char *pcVar4;
  char *__filename;
  
  pQVar2 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  __filename = (char *)(long)index;
  pQVar3 = (this->fields).d.ptr;
  pQVar1 = pQVar3 + (long)__filename;
  QMap<QString,_int>::remove(&this->fieldIndexMap,(char *)&pQVar3[(long)__filename].name);
  if ((pQVar3[(long)__filename].mandatory == true) && ((pQVar1->changedSignal).d.size != 0)) {
    pcVar4 = (pQVar1->changedSignal).d.ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect(pQVar1->object,pcVar4,(QObject *)pQVar1->page,
                        "1_q_maybeEmitCompleteChanged()");
  }
  QObject::disconnect(pQVar1->object,"2destroyed(QObject*)",pQVar2,
                      "1_q_handleFieldObjectDestroyed(QObject*)");
  QList<QWizardField>::remove(&this->fields,__filename);
  return;
}

Assistant:

void QWizardPrivate::removeFieldAt(int index)
{
    Q_Q(QWizard);

    const QWizardField &field = fields.at(index);
    fieldIndexMap.remove(field.name);
    if (field.mandatory && !field.changedSignal.isEmpty())
        QObject::disconnect(field.object, field.changedSignal,
                            field.page, SLOT(_q_maybeEmitCompleteChanged()));
    QObject::disconnect(
        field.object, SIGNAL(destroyed(QObject*)), q,
        SLOT(_q_handleFieldObjectDestroyed(QObject*)));
    fields.remove(index);
}